

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::RandomShaderCase::checkProgramLimits
          (RandomShaderCase *this,Shader *vtxShader,Shader *frgShader)

{
  int iVar1;
  int iVar2;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *pvVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestError *this_00;
  NotSupportedError *this_01;
  Enum<int,_2UL> EVar4;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a1;
  GetNameFunc local_a0;
  int local_98;
  GetNameFunc local_80;
  int local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  int local_28;
  GLenum error;
  int numSupported;
  int numRequiredCombinedSamplers;
  Shader *frgShader_local;
  Shader *vtxShader_local;
  RandomShaderCase *this_local;
  
  _numSupported = frgShader;
  frgShader_local = vtxShader;
  vtxShader_local = (Shader *)this;
  pvVar3 = rsg::Shader::getUniforms(vtxShader);
  iVar1 = getNumSamplerUniforms(pvVar3);
  pvVar3 = rsg::Shader::getUniforms(_numSupported);
  iVar2 = getNumSamplerUniforms(pvVar3);
  error = iVar1 + iVar2;
  if (0 < (int)error) {
    local_28 = -1;
    iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x8b4d,&local_28);
    iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    local_2c = (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x800))();
    if (local_2c != 0) {
      local_a1 = 1;
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      EVar4 = glu::getErrorStr(local_2c);
      local_a0 = EVar4.m_getName;
      local_98 = EVar4.m_value;
      local_80 = local_a0;
      local_78 = local_98;
      de::toString<tcu::Format::Enum<int,2ul>>(&local_70,(de *)&local_80,EVar4._8_8_);
      std::operator+(&local_50,"Limit query failed: ",&local_70);
      tcu::TestError::TestError(this_00,&local_50);
      local_a1 = 0;
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (local_28 < (int)error) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<int>(&local_128,(int *)&error);
      std::operator+(&local_108,"Program requires ",&local_128);
      std::operator+(&local_e8,&local_108," sampler(s). Implementation supports ");
      de::toString<int>(&local_148,&local_28);
      std::operator+(&local_c8,&local_e8,&local_148);
      tcu::NotSupportedError::NotSupportedError(this_01,&local_c8);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  return;
}

Assistant:

void RandomShaderCase::checkProgramLimits (const rsg::Shader& vtxShader, const rsg::Shader& frgShader) const
{
	const int numRequiredCombinedSamplers = getNumSamplerUniforms(vtxShader.getUniforms()) + getNumSamplerUniforms(frgShader.getUniforms());

	if (numRequiredCombinedSamplers > 0)
	{
		int				numSupported	= -1;
		GLenum			error;

		m_renderCtx.getFunctions().getIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &numSupported);
		error = m_renderCtx.getFunctions().getError();

		if (error != GL_NO_ERROR)
			throw tcu::TestError("Limit query failed: " + de::toString(glu::getErrorStr(error)));

		if (numSupported < numRequiredCombinedSamplers)
			throw tcu::NotSupportedError("Program requires " + de::toString(numRequiredCombinedSamplers) + " sampler(s). Implementation supports " + de::toString(numSupported));
	}
}